

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_subx_mem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  int opsize;
  MemOp_conflict memop;
  MemOp_conflict memop_00;
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 pTVar1;
  TCGContext_conflict2 *pTVar2;
  uint uVar3;
  TCGTemp *pTVar4;
  TCGv_i32 val;
  long lVar5;
  TCGContext_conflict2 *tcg_ctx;
  uintptr_t o;
  TCGv_i32 val_00;
  TCGv_i32 *ppTVar6;
  TCGv_i32 *ppTVar7;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar3 = insn >> 4 & 0xc;
  opsize = *(int *)(&DAT_00d7df10 + uVar3);
  lVar5 = (long)opsize;
  ppTVar7 = s->writeback;
  ppTVar6 = tcg_ctx_00->cpu_aregs;
  if (((uint)s->writeback_mask >> (insn & 7) & 1) != 0) {
    ppTVar6 = ppTVar7;
  }
  pTVar1 = ppTVar6[insn & 7];
  tcg_gen_subi_i32_m68k(tcg_ctx_00,pTVar1,pTVar1,*(int32_t *)(&DAT_00d7df20 + uVar3));
  uVar3 = ((s->base).tb)->flags;
  pTVar2 = s->uc->tcg_ctx;
  pTVar4 = tcg_temp_new_internal_m68k(pTVar2,TCG_TYPE_I32,false);
  val = (TCGv_i32)((long)pTVar4 - (long)pTVar2);
  tcg_gen_qemu_ld_i32_m68k
            (pTVar2,val,pTVar1,(ulong)((uVar3 >> 0xd & 1) == 0),
             *(MemOp_conflict *)(&DAT_00d7e474 + lVar5 * 4));
  uVar3 = insn >> 9 & 7;
  if (((uint)s->writeback_mask >> uVar3 & 1) == 0) {
    ppTVar7 = s->uc->tcg_ctx->cpu_aregs;
  }
  pTVar1 = ppTVar7[uVar3];
  tcg_gen_subi_i32_m68k(tcg_ctx_00,pTVar1,pTVar1,*(int32_t *)(&DAT_00d7e468 + lVar5 * 4));
  pTVar2 = s->uc->tcg_ctx;
  memop = *(MemOp_conflict *)(&DAT_00d7e474 + lVar5 * 4);
  memop_00 = *(MemOp_conflict *)(&DAT_00d7e480 + lVar5 * 4);
  uVar3 = ((s->base).tb)->flags;
  pTVar4 = tcg_temp_new_internal_m68k(pTVar2,TCG_TYPE_I32,false);
  val_00 = (TCGv_i32)((long)pTVar4 - (long)pTVar2);
  tcg_gen_qemu_ld_i32_m68k(pTVar2,val_00,pTVar1,(ulong)((uVar3 >> 0xd & 1) == 0),memop);
  gen_subx(s,val,val_00,opsize);
  tcg_gen_qemu_st_i32_m68k
            (s->uc->tcg_ctx,QREG_CC_N,pTVar1,(ulong)((((s->base).tb)->flags >> 0xd & 1) == 0),
             memop_00);
  tcg_temp_free_internal_m68k(tcg_ctx_00,(TCGTemp *)(val_00 + (long)tcg_ctx_00));
  tcg_temp_free_internal_m68k(tcg_ctx_00,(TCGTemp *)(val + (long)tcg_ctx_00));
  return;
}

Assistant:

DISAS_INSN(subx_mem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv addr_src;
    TCGv dest;
    TCGv addr_dest;
    int opsize;

    opsize = insn_opsize(insn);

    addr_src = AREG(insn, 0);
    tcg_gen_subi_i32(tcg_ctx, addr_src, addr_src, opsize_bytes(opsize));
    src = gen_load(s, opsize, addr_src, 1, IS_USER(s));

    addr_dest = AREG(insn, 9);
    tcg_gen_subi_i32(tcg_ctx, addr_dest, addr_dest, opsize_bytes(opsize));
    dest = gen_load(s, opsize, addr_dest, 1, IS_USER(s));

    gen_subx(s, src, dest, opsize);

    gen_store(s, opsize, addr_dest, QREG_CC_N, IS_USER(s));

    tcg_temp_free(tcg_ctx, dest);
    tcg_temp_free(tcg_ctx, src);
}